

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sha.c
# Opt level: O0

int ndn_sha256(uint8_t *data,uint32_t datalen,uint8_t *hash_result)

{
  int iVar1;
  undefined1 local_98 [8];
  ndn_sha256_state_t state;
  uint8_t *hash_result_local;
  uint32_t datalen_local;
  uint8_t *data_local;
  
  state.abs_state.s.leftover_offset = (size_t)hash_result;
  iVar1 = ndn_sha256_init((ndn_sha256_state_t *)local_98);
  if (iVar1 == 0) {
    iVar1 = ndn_sha256_update((ndn_sha256_state_t *)local_98,data,datalen);
    if (iVar1 == 0) {
      iVar1 = ndn_sha256_finish((ndn_sha256_state_t *)local_98,
                                (uint8_t *)state.abs_state.s.leftover_offset);
      if (iVar1 == 0) {
        data_local._4_4_ = 0;
      }
      else {
        data_local._4_4_ = -0x19;
      }
    }
    else {
      data_local._4_4_ = -0x1c;
    }
  }
  else {
    data_local._4_4_ = -0x1c;
  }
  return data_local._4_4_;
}

Assistant:

int
ndn_sha256(const uint8_t* data, uint32_t datalen, uint8_t* hash_result)
{
  ndn_sha256_state_t state;
  if (ndn_sha256_init(&state) != NDN_SUCCESS)
    return NDN_SEC_INIT_FAILURE;
  if (ndn_sha256_update(&state, data, datalen) != NDN_SUCCESS)
    return NDN_SEC_INIT_FAILURE;
  if (ndn_sha256_finish(&state, hash_result) != NDN_SUCCESS)
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  return NDN_SUCCESS;
}